

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelAnalyzer.cpp
# Opt level: O0

uint64_t __thiscall
SimpleParallelAnalyzer::AddFrame
          (SimpleParallelAnalyzer *this,uint16_t value,uint64_t starting_sample,
          uint64_t ending_sample)

{
  uint64_t uVar1;
  pointer pSVar2;
  unsigned_long *puVar3;
  unsigned_long local_78;
  unsigned_long local_70;
  uint64_t local_68;
  Frame frame;
  FrameV2 local_30 [8];
  FrameV2 frame_v2;
  uint64_t ending_sample_local;
  uint64_t starting_sample_local;
  uint16_t value_local;
  SimpleParallelAnalyzer *this_local;
  
  _frame_v2 = ending_sample;
  if (starting_sample <= ending_sample) {
    FrameV2::FrameV2(local_30);
    FrameV2::AddInteger((char *)local_30,0x11a030);
    Frame::Frame((Frame *)&local_68);
    _frame = _frame_v2;
    local_68 = starting_sample;
    pSVar2 = std::
             unique_ptr<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
             ::operator->(&this->mResults);
    AnalyzerResults::AddFrame((Frame *)pSVar2);
    pSVar2 = std::
             unique_ptr<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
             ::operator->(&this->mResults);
    AnalyzerResults::AddFrameV2((FrameV2 *)pSVar2,(char *)local_30,0x11a030,local_68);
    std::
    unique_ptr<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>::
    operator->(&this->mResults);
    AnalyzerResults::CommitResults();
    local_70 = _frame_v2 - starting_sample;
    local_78 = 1;
    puVar3 = std::max<unsigned_long>(&local_70,&local_78);
    uVar1 = _frame_v2;
    this->mLastFrameWidth = *puVar3;
    Frame::~Frame((Frame *)&local_68);
    FrameV2::~FrameV2(local_30);
    return uVar1;
  }
  __assert_fail("starting_sample <= ending_sample",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/saleae[P]simple-parallel-analyzer/src/SimpleParallelAnalyzer.cpp"
                ,0x12f,"uint64_t SimpleParallelAnalyzer::AddFrame(uint16_t, uint64_t, uint64_t)");
}

Assistant:

uint64_t SimpleParallelAnalyzer::AddFrame( uint16_t value, uint64_t starting_sample, uint64_t ending_sample )
{
    assert( starting_sample <= ending_sample );
    FrameV2 frame_v2;
    frame_v2.AddInteger( "data", value );

    Frame frame;
    frame.mData1 = value;
    frame.mFlags = 0;
    frame.mStartingSampleInclusive = starting_sample;
    frame.mEndingSampleInclusive = ending_sample;
    mResults->AddFrame( frame );
    mResults->AddFrameV2( frame_v2, "data", frame.mStartingSampleInclusive, frame.mEndingSampleInclusive );
    mResults->CommitResults();
    mLastFrameWidth = std::max<uint64_t>( ending_sample - starting_sample, 1 );
    return ending_sample;
}